

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O1

void __thiscall trun::ResultsReportJSON::PrintAssertError(ResultsReportJSON *this,Ref *result)

{
  AssertErrorItem *aerr;
  element_type *peVar1;
  Ref local_28;
  
  aerr = (((result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
         assertError).assertErrors.
         super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
         ._M_impl.super__Vector_impl_data._M_start;
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"IsAssertValid\" : true,");
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Assert\" : {");
  PrintAssert(this,aerr);
  peVar1 = (result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((ulong)(((long)*(pointer *)
                      ((long)&(peVar1->assertError).assertErrors.
                              super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               (long)(peVar1->assertError).assertErrors.
                     super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 2) {
    ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"}");
    return;
  }
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"},");
  local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  PrintAssertArray(this,&local_28);
  if (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    return;
  }
  return;
}

Assistant:

void ResultsReportJSON::PrintAssertError(const TestResult::Ref result) {
    auto &aerr = result->AssertError().Errors().front();

    WriteLine(R"("IsAssertValid" : true,)");
    // Up to v2.0.0 we only had this
    WriteLine(R"("Assert" : {)");
    PrintAssert(aerr);
    // This array is new from v2.1.0
    if (result->AssertError().NumErrors() > 1) {
        WriteLine("},");
        // NOTE: this is assumed to be last item in the parent object...
        PrintAssertArray(result);
    } else {
        WriteLine("}");
    }
}